

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Emb_ManPlacementRefine(Emb_Man_t *p,int nIters,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  unsigned_short *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  void *__ptr;
  void *__ptr_00;
  float *pArray;
  float *pArray_00;
  int *piVar7;
  int *__ptr_01;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  unsigned_short uVar11;
  int level;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  size_t __size;
  float fVar18;
  float fVar19;
  double dVar20;
  timespec ts;
  long local_70;
  timespec local_60;
  int *local_50;
  float *local_48;
  Emb_Man_t *local_40;
  int *local_38;
  
  iVar4 = clock_gettime(3,&local_60);
  if (iVar4 < 0) {
    local_70 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    local_70 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  if (p->pPlacement != (unsigned_short *)0x0) {
    __size = (long)p->nObjs << 2;
    __ptr = malloc(__size);
    __ptr_00 = malloc(__size);
    pArray = (float *)malloc(__size);
    pArray_00 = (float *)malloc(__size);
    if (0 < nIters) {
      iVar4 = 0;
      local_48 = pArray_00;
      local_40 = p;
      do {
        iVar6 = p->nObjData;
        if (iVar6 < 1) {
LAB_0068840e:
          dVar20 = 0.0;
        }
        else {
          local_38 = p->pObjData;
          local_50 = local_38 + 5;
          uVar10 = 0;
          dVar20 = 0.0;
          do {
            if (local_38 == (int *)0x0) goto LAB_0068840e;
            puVar1 = (uint *)(local_38 + uVar10);
            puVar3 = p->pPlacement;
            uVar8 = puVar1[4];
            uVar13 = (uint)puVar3[uVar8 * 2];
            uVar16 = (uint)puVar3[(ulong)(uVar8 * 2) + 1];
            uVar2 = puVar1[1];
            uVar14 = uVar13;
            uVar17 = uVar16;
            if (0 < (long)(int)uVar2) {
              lVar9 = 0;
              do {
                uVar5 = (uint)puVar3[puVar1[(long)local_50[(ulong)(*puVar1 >> 4) + uVar10 + lVar9] +
                                            4] * 2];
                if (puVar3[puVar1[(long)local_50[(ulong)(*puVar1 >> 4) + uVar10 + lVar9] + 4] * 2]
                    <= uVar13) {
                  uVar13 = uVar5;
                }
                if (uVar14 <= uVar5) {
                  uVar14 = uVar5;
                }
                uVar5 = (uint)puVar3[(ulong)(puVar1[(long)local_50[(ulong)(*puVar1 >> 4) +
                                                                   uVar10 + lVar9] + 4] * 2) + 1];
                if (puVar3[(ulong)(puVar1[(long)local_50[(ulong)(*puVar1 >> 4) + uVar10 + lVar9] + 4
                                         ] * 2) + 1] <= uVar16) {
                  uVar16 = uVar5;
                }
                if (uVar17 <= uVar5) {
                  uVar17 = uVar5;
                }
                lVar9 = lVar9 + 1;
              } while ((int)uVar2 != lVar9);
            }
            *(float *)((long)__ptr + (ulong)uVar8 * 4) = (float)(uVar14 + uVar13) * 0.5;
            *(float *)((long)__ptr_00 + (ulong)uVar8 * 4) = (float)(uVar17 + uVar16) * 0.5;
            dVar20 = dVar20 + (double)(int)((uVar14 - (uVar13 + uVar16)) + uVar17);
            uVar8 = (*puVar1 >> 4) + (int)uVar10 + uVar2 + 5;
            uVar10 = (ulong)uVar8;
            pArray_00 = local_48;
            p = local_40;
          } while ((int)uVar8 < iVar6);
        }
        if ((0 < iVar6) && (piVar7 = p->pObjData, piVar7 != (int *)0x0)) {
          uVar10 = 0;
          do {
            puVar1 = (uint *)(piVar7 + uVar10);
            uVar12 = (ulong)puVar1[4];
            fVar19 = *(float *)((long)__ptr + uVar12 * 4);
            fVar18 = *(float *)((long)__ptr_00 + uVar12 * 4);
            uVar8 = *puVar1 >> 4;
            if (0xf < *puVar1) {
              uVar15 = 0;
              do {
                fVar19 = fVar19 + *(float *)((long)__ptr +
                                            (ulong)puVar1[4 - (long)(int)puVar1[uVar15 + 5]] * 4);
                fVar18 = fVar18 + *(float *)((long)__ptr_00 +
                                            (ulong)puVar1[4 - (long)(int)puVar1[uVar15 + 5]] * 4);
                uVar15 = uVar15 + 1;
              } while (uVar8 != uVar15);
            }
            pArray[uVar12] = fVar19 / (float)(uVar8 + 1);
            pArray_00[puVar1[4]] = fVar18 / (float)((*puVar1 >> 4) + 1);
            uVar8 = (int)uVar10 + (*puVar1 >> 4) + puVar1[1] + 5;
            uVar10 = (ulong)uVar8;
          } while ((int)uVar8 < iVar6);
        }
        piVar7 = Gia_SortFloats(pArray,(int *)0x0,p->nObjs);
        __ptr_01 = Gia_SortFloats(pArray_00,(int *)0x0,p->nObjs);
        iVar6 = p->nObjs;
        if (0 < (long)iVar6) {
          puVar3 = p->pPlacement;
          lVar9 = 0;
          do {
            uVar11 = (unsigned_short)(int)(((double)(int)lVar9 * 32767.0) / (double)iVar6);
            puVar3[(long)piVar7[lVar9] * 2] = uVar11;
            puVar3[(long)__ptr_01[lVar9] * 2 + 1] = uVar11;
            lVar9 = lVar9 + 1;
          } while (iVar6 != lVar9);
        }
        if (piVar7 != (int *)0x0) {
          free(piVar7);
        }
        if (__ptr_01 != (int *)0x0) {
          free(__ptr_01);
        }
        if (fVerbose != 0) {
          iVar6 = 0x922698;
          printf("%2d : HPWL = %e  ",dVar20,(ulong)(iVar4 + 1));
          Abc_Print(iVar6,"%s =","Time");
          level = 3;
          iVar6 = clock_gettime(3,&local_60);
          if (iVar6 < 0) {
            lVar9 = -1;
          }
          else {
            lVar9 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          Abc_Print(level,"%9.2f sec\n",(double)(lVar9 + local_70) / 1000000.0);
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != nIters);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    if (pArray != (float *)0x0) {
      free(pArray);
    }
    if (pArray_00 != (float *)0x0) {
      free(pArray_00);
    }
  }
  return;
}

Assistant:

void Emb_ManPlacementRefine( Emb_Man_t * p, int nIters, int fVerbose )
{
    Emb_Obj_t * pThis, * pNext;
    double CostThis, CostPrev;
    float * pEdgeX, * pEdgeY;
    float * pVertX, * pVertY;
    float VertX, VertY;
    int * pPermX, * pPermY;
    int i, k, Iter, iMinX, iMaxX, iMinY, iMaxY;
    abctime clk = Abc_Clock();
    if ( p->pPlacement == NULL )
        return;
    pEdgeX = ABC_ALLOC( float, p->nObjs );
    pEdgeY = ABC_ALLOC( float, p->nObjs );
    pVertX = ABC_ALLOC( float, p->nObjs );
    pVertY = ABC_ALLOC( float, p->nObjs );
    // refine placement
    CostPrev = 0.0;
    for ( Iter = 0; Iter < nIters; Iter++ )
    {
        // compute centers of hyperedges
        CostThis = 0.0;
        Emb_ManForEachObj( p, pThis, i )
        {
            iMinX = iMaxX = p->pPlacement[2*pThis->Value+0];
            iMinY = iMaxY = p->pPlacement[2*pThis->Value+1];
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                iMinX = Abc_MinInt( iMinX, p->pPlacement[2*pNext->Value+0] );
                iMaxX = Abc_MaxInt( iMaxX, p->pPlacement[2*pNext->Value+0] );
                iMinY = Abc_MinInt( iMinY, p->pPlacement[2*pNext->Value+1] );
                iMaxY = Abc_MaxInt( iMaxY, p->pPlacement[2*pNext->Value+1] );
            }
            pEdgeX[pThis->Value] = 0.5 * (iMaxX + iMinX);
            pEdgeY[pThis->Value] = 0.5 * (iMaxY + iMinY);
            CostThis += (iMaxX - iMinX) + (iMaxY - iMinY);
        }
        // compute new centers of objects
        Emb_ManForEachObj( p, pThis, i )
        {
            VertX = pEdgeX[pThis->Value];
            VertY = pEdgeY[pThis->Value];
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                VertX += pEdgeX[pNext->Value];
                VertY += pEdgeY[pNext->Value];
            }
            pVertX[pThis->Value] = VertX / (Emb_ObjFaninNum(pThis) + 1);
            pVertY[pThis->Value] = VertY / (Emb_ObjFaninNum(pThis) + 1);
        }
        // sort these numbers
        pPermX = Gia_SortFloats( pVertX, NULL, p->nObjs );
        pPermY = Gia_SortFloats( pVertY, NULL, p->nObjs );
        for ( k = 0; k < p->nObjs; k++ )
        {
            p->pPlacement[2*pPermX[k]+0] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
            p->pPlacement[2*pPermY[k]+1] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
        }
        ABC_FREE( pPermX );
        ABC_FREE( pPermY );
        // evaluate cost
        if ( fVerbose )
        {
        printf( "%2d : HPWL = %e  ", Iter+1, CostThis );
        ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }
    ABC_FREE( pEdgeX );
    ABC_FREE( pEdgeY );
    ABC_FREE( pVertX );
    ABC_FREE( pVertY );
}